

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O2

void embree::avx::evalGrid
               (SubdivPatch1Base *patch,uint x0,uint x1,uint y0,uint y1,uint swidth,uint sheight,
               float *grid_x,float *grid_y,float *grid_z,float *grid_u,float *grid_v,
               SubdivMesh *geom)

{
  uint dwidth;
  ulong uVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar4;
  size_t size;
  pointer pRVar5;
  uint *puVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  long lVar9;
  code *pcVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar24;
  uint uVar25;
  size_t i_1;
  ulong uVar26;
  void *pvVar27;
  float *pfVar28;
  uint *puVar29;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *Nx;
  int iVar30;
  int iVar31;
  uint *puVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  float *pfVar36;
  undefined4 *puVar37;
  uint uVar38;
  uint uVar39;
  float *pfVar40;
  uint uVar41;
  ulong uVar42;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar43;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar44;
  int iVar45;
  uint i;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  uint *puVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar66;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar67 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 in_ZMM5 [64];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar86 [12];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar89 [64];
  float fVar92;
  undefined1 auVar91 [32];
  float in_register_0000155c;
  undefined1 auVar93 [32];
  undefined1 auVar95 [16];
  undefined1 auVar94 [32];
  float in_register_0000159c;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 in_ZMM15 [64];
  vfloatx_conflict v;
  RTCDisplacementFunctionNArguments args;
  Vec3vfx_conflict normal;
  Vec3vfx_conflict vtx;
  vfloatx_conflict u;
  uint local_4ebc;
  uint local_4eb8;
  float local_4eb4;
  ulong local_4eb0;
  uint *local_4e88;
  float local_4e74;
  long local_4e00;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4de0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4dc0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_4da0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_4d98;
  undefined1 *puStack_4d90;
  undefined1 (*pauStack_4d88) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4d80;
  float **ppfStack_4d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_4d70;
  float fStack_4d68;
  undefined4 uStack_4d64;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_3dc0;
  ulong local_3db8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3d80;
  undefined1 local_3d60 [32];
  undefined1 local_3d40 [126] [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_2d80;
  ulong local_2d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d40;
  uint uStack_2d30;
  uint uStack_2d2c;
  float *pfStack_2d28;
  float *local_2d20;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d18;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d10;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d00;
  float *pfStack_2cf0;
  uint uStack_2ce8;
  undefined4 uStack_2ce4;
  undefined4 local_29dc [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1140;
  undefined4 local_1100;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_10c0 [128];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_c0;
  ulong local_b8;
  undefined1 auVar60 [64];
  undefined1 auVar68 [64];
  
  uVar25 = x1 - x0;
  dwidth = uVar25 + 1;
  iVar45 = y1 - y0;
  uVar48 = iVar45 + 1;
  uVar41 = uVar48 * dwidth;
  uVar33 = uVar41 + 7;
  uVar46 = (ulong)uVar41;
  if (patch->type == '\x05') {
    local_3db8 = (ulong)(uVar41 + 8);
    Nx = *(anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 **)&(geom->super_Geometry).field_0x58;
    if (Nx == (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
      local_3db8 = 0;
    }
    local_2d78 = local_3db8;
    local_b8 = local_3db8;
    if (local_3db8 < 0x401) {
      local_2d80 = &local_3d80;
      local_3dc0 = &local_4dc0;
      local_c0 = local_10c0;
    }
    else {
      size = local_3db8 * 4;
      local_2d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_3dc0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
    }
    pRVar5 = (geom->patch_eval_trees).
             super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((geom->patch_eval_trees).
        super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish == pRVar5) {
      lVar34 = 0x40;
      puVar6 = *(uint **)&patch->patch_v[0][0].field_0;
      uVar25 = patch->time_;
      pBVar7 = (geom->vertices).items;
      lVar35 = 0x1c00;
      puVar37 = local_29dc;
      do {
        *(undefined4 **)(puVar37 + -0x49) = puVar37 + -0xc9;
        *(undefined4 **)(puVar37 + -0x19) = puVar37 + -0x39;
        *(undefined8 *)(puVar37 + -2) = 0;
        *puVar37 = 0;
        puVar37 = puVar37 + 0xe0;
        lVar35 = lVar35 + -0x380;
      } while (lVar35 != 0);
      local_1140 = &local_2d40;
      pcVar8 = pBVar7[uVar25].super_RawBufferView.ptr_ofs;
      uVar26 = (ulong)(uint)pBVar7[uVar25].super_RawBufferView.stride;
      local_4e00 = 0x280;
      uVar42 = 0;
      local_4e88 = puVar6;
      do {
        if ((7 < uVar42) && (local_1140 == &local_2d40)) {
          pvVar27 = GeneralCatmullClark1RingT<embree::Vec3fa,embree::Vec3fa>::operator_new__(0x3840)
          ;
          *(undefined8 *)((long)pvVar27 + 0x38) = 0x10;
          lVar35 = 0;
          do {
            *(long *)((long)pvVar27 + lVar35 + 0x280) = (long)pvVar27 + lVar35 + 0x80;
            *(long *)((long)pvVar27 + lVar35 + 0x340) = (long)pvVar27 + lVar35 + 0x2c0;
            *(undefined8 *)((long)pvVar27 + lVar35 + 0x39c) = 0;
            *(undefined4 *)((long)pvVar27 + lVar35 + 0x3a4) = 0;
            lVar35 = lVar35 + 0x380;
          } while (lVar35 != 0x3800);
          local_1140 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)pvVar27 + 0x40);
          for (lVar35 = 0; lVar35 != 0x1c00; lVar35 = lVar35 + 0x380) {
            GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                      ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)local_1140 + lVar35),
                       (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)&local_2d40 + lVar35));
          }
        }
        paVar24 = local_1140;
        uVar1 = uVar42 + 1;
        paVar3 = local_1140 + uVar42 * 0x38;
        paVar4 = local_1140 + uVar42 * 0x38;
        pfVar40 = paVar4->m128 + 0x10;
        *(undefined1 *)(paVar4->m128 + 0xd6) = 1;
        paVar4->m128[0xd2] = -NAN;
        uVar18 = *(undefined8 *)(pcVar8 + *local_4e88 * uVar26);
        uVar19 = *(undefined8 *)(pcVar8 + *local_4e88 * uVar26 + 8);
        *(float *)paVar4 = (float)(int)uVar18;
        *(int *)((long)paVar4 + 4) = (int)((ulong)uVar18 >> 0x20);
        *(undefined8 *)&(paVar4->field_1).z = uVar19;
        paVar4->m128[0xd3] = (float)local_4e88[5];
        paVar4->m128[0xd5] = (float)local_4e88[6];
        paVar4->m128[0xd4] = 0.0;
        pfVar36 = local_1140->m128 + uVar42 * 0xe0 + 0xa0;
        local_4eb0 = 0;
        local_4eb4 = -NAN;
        local_4eb8 = 0xffffffff;
        local_4ebc = 0xffffffff;
        fVar66 = 0.0;
        puVar29 = local_4e88;
        do {
          puVar32 = puVar29 + (long)(int)puVar29[2] * 8;
          uVar25 = puVar29[1];
          auVar52 = vmaxss_avx(ZEXT416(puVar29[6]),ZEXT416((uint)paVar3[0x35].m128[0]));
          fVar69 = (float)puVar29[4];
          paVar3[0x35].m128[0] = auVar52._0_4_;
          bVar50 = puVar29[(long)(int)uVar25 * 8] < local_4ebc;
          if (bVar50) {
            local_4eb4 = fVar66;
          }
          if (bVar50) {
            local_4eb8 = (uint)local_4eb0;
          }
          puVar49 = puVar29 + (long)(int)uVar25 * 8;
          if (bVar50) {
            local_4ebc = puVar29[(long)(int)uVar25 * 8];
          }
          local_4e74 = 0.0;
          for (; uVar47 = (ulong)(uint)fVar66, puVar49 != puVar32;
              puVar49 = puVar49 + (long)(int)puVar49[1] * 8) {
            auVar52 = *(undefined1 (*) [16])(pcVar8 + *puVar49 * uVar26);
            fVar66 = (float)((int)fVar66 + 1);
            pfVar28 = *(float **)(paVar3 + 0x24);
            if ((0x20 < (uint)fVar66) && (pfVar28 == pfVar40)) {
              pvVar27 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar3 + 0x24) = pvVar27;
              for (lVar35 = 0; lVar35 != 0x200; lVar35 = lVar35 + 0x10) {
                lVar9 = *(long *)(paVar3 + 0x24);
                puVar2 = (undefined8 *)((long)paVar24 + lVar35 + lVar34);
                uVar18 = puVar2[1];
                *(undefined8 *)(lVar9 + lVar35) = *puVar2;
                ((undefined8 *)(lVar9 + lVar35))[1] = uVar18;
              }
              pfVar28 = *(float **)(paVar3 + 0x24);
            }
            *(undefined1 (*) [16])(pfVar28 + uVar47 * 4) = auVar52;
            local_4e74 = (float)((int)local_4e74 + 1);
          }
          uVar25 = (uint)local_4eb0 + 1;
          pfVar28 = *(float **)(paVar3 + 0x30);
          if ((0x10 < uVar25) && (pfVar28 == pfVar36)) {
            pvVar27 = operator_new__(0x200);
            *(void **)(paVar3 + 0x30) = pvVar27;
            for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 1) {
              *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar35 * 8) =
                   *(undefined8 *)((long)paVar24 + lVar35 * 8 + local_4e00);
            }
            pfVar28 = *(float **)(paVar3 + 0x30);
          }
          pfVar28[local_4eb0 * 2] = local_4e74;
          pfVar28[local_4eb0 * 2 + 1] = fVar69;
          *(byte *)((long)paVar3 + 0x358) =
               *(byte *)((long)paVar3 + 0x358) & local_4e74 == 2.8026e-45;
          if ((long)(int)puVar32[3] == 0) {
            if (*puVar32 < local_4ebc) {
              local_4ebc = *puVar32;
              local_4eb4 = fVar66;
              local_4eb8 = uVar25;
            }
            *(uint *)((long)paVar3 + 0x348) = uVar25;
            uVar38 = (uint)local_4eb0 + 2;
            local_4eb0 = (ulong)uVar38;
            pfVar28 = *(float **)(paVar3 + 0x30);
            if ((0x10 < uVar38) && (pfVar28 == pfVar36)) {
              pvVar27 = operator_new__(0x200);
              *(void **)(paVar3 + 0x30) = pvVar27;
              for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 1) {
                *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar35 * 8) =
                     *(undefined8 *)((long)paVar24 + lVar35 * 8 + local_4e00);
              }
              pfVar28 = *(float **)(paVar3 + 0x30);
            }
            (pfVar28 + (ulong)uVar25 * 2)[0] = 2.8026e-45;
            (pfVar28 + (ulong)uVar25 * 2)[1] = INFINITY;
            uVar18 = *(undefined8 *)(pcVar8 + *puVar32 * uVar26);
            uVar19 = *(undefined8 *)(pcVar8 + *puVar32 * uVar26 + 8);
            uVar25 = (int)fVar66 + 1;
            pfVar28 = *(float **)(paVar3 + 0x24);
            if ((0x20 < uVar25) && (pfVar28 == pfVar40)) {
              pvVar27 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar3 + 0x24) = pvVar27;
              for (lVar35 = 0; lVar35 != 0x200; lVar35 = lVar35 + 0x10) {
                lVar9 = *(long *)(paVar3 + 0x24);
                puVar2 = (undefined8 *)((long)paVar24 + lVar35 + lVar34);
                uVar20 = puVar2[1];
                *(undefined8 *)(lVar9 + lVar35) = *puVar2;
                ((undefined8 *)(lVar9 + lVar35))[1] = uVar20;
              }
              pfVar28 = *(float **)(paVar3 + 0x24);
            }
            *(undefined8 *)(pfVar28 + uVar47 * 4) = uVar18;
            *(undefined8 *)(pfVar28 + uVar47 * 4 + 2) = uVar19;
            fVar66 = (float)((int)fVar66 + 2);
            pfVar28 = *(float **)(paVar3 + 0x24);
            if ((0x20 < (uint)fVar66) && (pfVar28 == pfVar40)) {
              pvVar27 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar3 + 0x24) = pvVar27;
              for (lVar35 = 0; lVar35 != 0x200; lVar35 = lVar35 + 0x10) {
                lVar9 = *(long *)(paVar3 + 0x24);
                puVar2 = (undefined8 *)((long)paVar24 + lVar35 + lVar34);
                uVar18 = puVar2[1];
                *(undefined8 *)(lVar9 + lVar35) = *puVar2;
                ((undefined8 *)(lVar9 + lVar35))[1] = uVar18;
              }
              pfVar28 = *(float **)(paVar3 + 0x24);
            }
            *(__m128 *)(pfVar28 + (ulong)uVar25 * 4) = *(__m128 *)paVar3;
            for (puVar29 = local_4e88; lVar35 = (long)(int)puVar29[3], lVar35 != 0;
                puVar29 = puVar29 + lVar35 * 8 + (long)(int)puVar29[lVar35 * 8 + 1] * 8) {
            }
          }
          else {
            puVar29 = puVar32 + (long)(int)puVar32[3] * 8;
            local_4eb0 = (ulong)uVar25;
          }
        } while (puVar29 != local_4e88);
        *(float *)((long)paVar3 + 0x344) = fVar66;
        paVar3[0x34].m128[0] = (float)local_4eb0;
        *(uint *)((long)paVar3 + 0x364) = local_4ebc;
        *(uint *)((long)paVar3 + 0x35c) = local_4eb8;
        paVar3[0x36].m128[0] = local_4eb4;
        if (0xe < uVar42) break;
        local_4e88 = local_4e88 + (long)(int)local_4e88[1] * 8;
        lVar34 = lVar34 + 0x380;
        local_4e00 = local_4e00 + 0x380;
        uVar42 = uVar1;
      } while (local_4e88 != puVar6);
      local_1100 = (undefined4)uVar1;
      pfVar36 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar36 = patch->level;
      }
      paVar43 = Nx;
      paVar44 = Nx;
      if (Nx != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Nx = local_2d80;
        paVar43 = local_c0;
        paVar44 = local_3dc0;
      }
      feature_adaptive_eval_grid<embree::avx::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1,
                 (uint)patch->patch_v[0][0].field_0.m128[2],pfVar36,x0,x1,y0,y1,swidth,sheight,
                 grid_x,grid_y,grid_z,grid_u,grid_v,Nx->v,paVar44->v,paVar43->v,dwidth,uVar48);
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1);
    }
    else {
      pfVar36 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar36 = patch->level;
      }
      paVar43 = Nx;
      paVar44 = Nx;
      if (Nx != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Nx = local_3dc0;
        paVar43 = local_2d80;
        paVar44 = local_c0;
      }
      feature_adaptive_eval_grid<embree::avx::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                (pRVar5 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_)
                          * 8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar36,x0,x1,y0,y1,swidth,
                 sheight,grid_x,grid_y,grid_z,grid_u,grid_v,paVar43->v,Nx->v,paVar44->v,dwidth,
                 uVar48);
    }
    auVar52 = ZEXT416((uint)((float)patch->u[0] * 0.00012207031));
    auVar52 = vshufps_avx(auVar52,auVar52,0);
    auVar53 = ZEXT416((uint)((float)patch->u[3] * 0.00012207031));
    auVar53 = vshufps_avx(auVar53,auVar53,0);
    auVar54 = ZEXT416((uint)((float)patch->u[1] * 0.00012207031));
    auVar54 = vshufps_avx(auVar54,auVar54,0);
    auVar55 = ZEXT416((uint)((float)patch->u[2] * 0.00012207031));
    auVar55 = vshufps_avx(auVar55,auVar55,0);
    auVar51 = ZEXT416((uint)((float)patch->v[0] * 0.00012207031));
    auVar51 = vshufps_avx(auVar51,auVar51,0);
    auVar83 = ZEXT416((uint)((float)patch->v[3] * 0.00012207031));
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar67 = ZEXT416((uint)((float)patch->v[1] * 0.00012207031));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar88 = ZEXT416((uint)((float)patch->v[2] * 0.00012207031));
    auVar88 = vshufps_avx(auVar88,auVar88,0);
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = 0x3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar85._16_4_ = 0x3f800000;
    auVar85._20_4_ = 0x3f800000;
    auVar85._24_4_ = 0x3f800000;
    auVar85._28_4_ = 0x3f800000;
    for (lVar34 = 0; (ulong)(uVar33 >> 3) << 5 != lVar34; lVar34 = lVar34 + 0x20) {
      auVar11 = *(undefined1 (*) [32])((long)grid_u + lVar34);
      auVar57 = *(undefined1 (*) [32])((long)grid_v + lVar34);
      auVar12 = vsubps_avx(auVar85,auVar11);
      auVar58 = vsubps_avx(auVar85,auVar57);
      fVar69 = auVar57._0_4_;
      fVar70 = auVar57._4_4_;
      fVar71 = auVar57._8_4_;
      fVar72 = auVar57._12_4_;
      fVar73 = auVar57._16_4_;
      fVar74 = auVar57._20_4_;
      fVar76 = auVar57._24_4_;
      fVar77 = auVar58._0_4_;
      fVar78 = auVar58._4_4_;
      fVar79 = auVar58._8_4_;
      fVar80 = auVar58._12_4_;
      fVar81 = auVar58._16_4_;
      fVar82 = auVar58._20_4_;
      fVar92 = auVar58._24_4_;
      fVar66 = in_ZMM15._28_4_;
      in_register_0000155c =
           in_register_0000155c + in_register_0000159c + in_register_0000159c + fVar66;
      fVar96 = fVar77 * auVar51._0_4_;
      fVar97 = fVar78 * auVar51._4_4_;
      fVar98 = fVar79 * auVar51._8_4_;
      fVar99 = fVar80 * auVar51._12_4_;
      fVar100 = fVar81 * auVar51._0_4_;
      fVar61 = fVar82 * auVar51._4_4_;
      fVar62 = fVar92 * auVar51._8_4_;
      in_ZMM15 = ZEXT3264(CONCAT428(fVar66,CONCAT424(fVar62,CONCAT420(fVar61,CONCAT416(fVar100,
                                                  CONCAT412(fVar99,CONCAT48(fVar98,CONCAT44(fVar97,
                                                  fVar96))))))));
      in_register_0000159c = in_register_0000159c + fVar66 + fVar66;
      pfVar36 = (float *)((long)grid_u + lVar34);
      *pfVar36 = auVar12._0_4_ * (fVar69 * auVar53._0_4_ + fVar77 * auVar52._0_4_) +
                 auVar11._0_4_ * (fVar69 * auVar55._0_4_ + fVar77 * auVar54._0_4_);
      pfVar36[1] = auVar12._4_4_ * (fVar70 * auVar53._4_4_ + fVar78 * auVar52._4_4_) +
                   auVar11._4_4_ * (fVar70 * auVar55._4_4_ + fVar78 * auVar54._4_4_);
      pfVar36[2] = auVar12._8_4_ * (fVar71 * auVar53._8_4_ + fVar79 * auVar52._8_4_) +
                   auVar11._8_4_ * (fVar71 * auVar55._8_4_ + fVar79 * auVar54._8_4_);
      pfVar36[3] = auVar12._12_4_ * (fVar72 * auVar53._12_4_ + fVar80 * auVar52._12_4_) +
                   auVar11._12_4_ * (fVar72 * auVar55._12_4_ + fVar80 * auVar54._12_4_);
      pfVar36[4] = auVar12._16_4_ * (fVar73 * auVar53._0_4_ + fVar81 * auVar52._0_4_) +
                   auVar11._16_4_ * (fVar73 * auVar55._0_4_ + fVar81 * auVar54._0_4_);
      pfVar36[5] = auVar12._20_4_ * (fVar74 * auVar53._4_4_ + fVar82 * auVar52._4_4_) +
                   auVar11._20_4_ * (fVar74 * auVar55._4_4_ + fVar82 * auVar54._4_4_);
      pfVar36[6] = auVar12._24_4_ * (fVar76 * auVar53._8_4_ + fVar92 * auVar52._8_4_) +
                   auVar11._24_4_ * (fVar76 * auVar55._8_4_ + fVar92 * auVar54._8_4_);
      pfVar36[7] = in_register_0000155c;
      pfVar36 = (float *)((long)grid_v + lVar34);
      *pfVar36 = auVar12._0_4_ * (fVar69 * auVar83._0_4_ + fVar96) +
                 auVar11._0_4_ * (fVar69 * auVar88._0_4_ + fVar77 * auVar67._0_4_);
      pfVar36[1] = auVar12._4_4_ * (fVar70 * auVar83._4_4_ + fVar97) +
                   auVar11._4_4_ * (fVar70 * auVar88._4_4_ + fVar78 * auVar67._4_4_);
      pfVar36[2] = auVar12._8_4_ * (fVar71 * auVar83._8_4_ + fVar98) +
                   auVar11._8_4_ * (fVar71 * auVar88._8_4_ + fVar79 * auVar67._8_4_);
      pfVar36[3] = auVar12._12_4_ * (fVar72 * auVar83._12_4_ + fVar99) +
                   auVar11._12_4_ * (fVar72 * auVar88._12_4_ + fVar80 * auVar67._12_4_);
      pfVar36[4] = auVar12._16_4_ * (fVar73 * auVar83._0_4_ + fVar100) +
                   auVar11._16_4_ * (fVar73 * auVar88._0_4_ + fVar81 * auVar67._0_4_);
      pfVar36[5] = auVar12._20_4_ * (fVar74 * auVar83._4_4_ + fVar61) +
                   auVar11._20_4_ * (fVar74 * auVar88._4_4_ + fVar82 * auVar67._4_4_);
      pfVar36[6] = auVar12._24_4_ * (fVar76 * auVar83._8_4_ + fVar62) +
                   auVar11._24_4_ * (fVar76 * auVar88._8_4_ + fVar92 * auVar67._8_4_);
      pfVar36[7] = auVar57._28_4_ + auVar58._28_4_ + auVar11._28_4_;
    }
    pcVar10 = *(code **)&(geom->super_Geometry).field_0x58;
    if (pcVar10 != (code *)0x0) {
      local_2d40._0_8_ = (geom->super_Geometry).userPtr;
      uStack_2d30 = patch->prim;
      uStack_2d2c = patch->time_;
      pfStack_2d28 = grid_u;
      local_2d20 = grid_v;
      paStack_2d18 = local_2d80;
      paStack_2d10 = local_3dc0;
      paStack_2d08 = local_c0;
      local_2d00._0_8_ = grid_x;
      local_2d00._8_8_ = grid_y;
      pfStack_2cf0 = grid_z;
      local_2d40._8_8_ = geom;
      uStack_2ce8 = uVar41;
      (*pcVar10)();
    }
    uVar41 = uVar41 - 1;
    fVar66 = grid_u[uVar41];
    fVar69 = grid_v[uVar41];
    fVar70 = grid_x[uVar41];
    fVar71 = grid_y[uVar41];
    fVar72 = grid_z[uVar41];
    for (; uVar46 < (uVar33 & 0xfffffff8); uVar46 = uVar46 + 1) {
      grid_u[uVar46] = fVar66;
      grid_v[uVar46] = fVar69;
      grid_x[uVar46] = fVar70;
      grid_y[uVar46] = fVar71;
      grid_z[uVar46] = fVar72;
    }
    if (local_c0 != local_10c0) {
      alignedFree(local_c0);
    }
    if (local_3dc0 != &local_4dc0) {
      alignedFree(local_3dc0);
    }
    if (local_2d80 != &local_3d80) {
      alignedFree(local_2d80);
    }
  }
  else {
    auVar52 = vpshufd_avx(ZEXT416(swidth),0);
    auVar54 = vpcmpeqd_avx(ZEXT416(swidth),ZEXT416(swidth));
    auVar52 = vpaddd_avx(auVar52,auVar54);
    auVar53 = vpshufd_avx(ZEXT416(sheight),0);
    auVar53 = vpaddd_avx(auVar53,auVar54);
    auVar57._16_16_ = auVar52;
    auVar57._0_16_ = auVar52;
    auVar85 = vcvtdq2ps_avx(auVar57);
    auVar11 = vrcpps_avx(auVar85);
    fVar66 = auVar11._0_4_;
    auVar68._0_4_ = fVar66 * auVar85._0_4_;
    fVar69 = auVar11._4_4_;
    auVar68._4_4_ = fVar69 * auVar85._4_4_;
    fVar70 = auVar11._8_4_;
    auVar68._8_4_ = fVar70 * auVar85._8_4_;
    fVar71 = auVar11._12_4_;
    auVar68._12_4_ = fVar71 * auVar85._12_4_;
    fVar72 = auVar11._16_4_;
    auVar68._16_4_ = fVar72 * auVar85._16_4_;
    fVar73 = auVar11._20_4_;
    auVar68._20_4_ = fVar73 * auVar85._20_4_;
    fVar74 = auVar11._24_4_;
    auVar68._28_36_ = in_ZMM5._28_36_;
    auVar68._24_4_ = fVar74 * auVar85._24_4_;
    auVar58._8_4_ = 0x3f800000;
    auVar58._0_8_ = 0x3f8000003f800000;
    auVar58._12_4_ = 0x3f800000;
    auVar58._16_4_ = 0x3f800000;
    auVar58._20_4_ = 0x3f800000;
    auVar58._24_4_ = 0x3f800000;
    auVar58._28_4_ = 0x3f800000;
    auVar60 = ZEXT3264(auVar58);
    auVar12 = vsubps_avx(auVar58,auVar68._0_32_);
    auVar75._16_16_ = auVar53;
    auVar75._0_16_ = auVar53;
    auVar85 = vcvtdq2ps_avx(auVar75);
    auVar57 = vrcpps_avx(auVar85);
    fVar66 = fVar66 + fVar66 * auVar12._0_4_;
    fVar69 = fVar69 + fVar69 * auVar12._4_4_;
    fVar70 = fVar70 + fVar70 * auVar12._8_4_;
    fVar71 = fVar71 + fVar71 * auVar12._12_4_;
    fVar72 = fVar72 + fVar72 * auVar12._16_4_;
    fVar73 = fVar73 + fVar73 * auVar12._20_4_;
    fVar74 = fVar74 + fVar74 * auVar12._24_4_;
    auVar68 = ZEXT3264(CONCAT428(auVar11._28_4_ + auVar12._28_4_,
                                 CONCAT424(fVar74,CONCAT420(fVar73,CONCAT416(fVar72,CONCAT412(fVar71
                                                  ,CONCAT48(fVar70,CONCAT44(fVar69,fVar66))))))));
    fVar76 = auVar57._0_4_;
    fVar77 = auVar57._4_4_;
    auVar11._4_4_ = fVar77 * auVar85._4_4_;
    auVar11._0_4_ = fVar76 * auVar85._0_4_;
    fVar78 = auVar57._8_4_;
    auVar11._8_4_ = fVar78 * auVar85._8_4_;
    fVar79 = auVar57._12_4_;
    auVar11._12_4_ = fVar79 * auVar85._12_4_;
    fVar80 = auVar57._16_4_;
    auVar11._16_4_ = fVar80 * auVar85._16_4_;
    fVar81 = auVar57._20_4_;
    auVar11._20_4_ = fVar81 * auVar85._20_4_;
    fVar82 = auVar57._24_4_;
    auVar11._24_4_ = fVar82 * auVar85._24_4_;
    auVar11._28_4_ = auVar12._28_4_;
    auVar85 = vsubps_avx(auVar58,auVar11);
    auVar55 = vpshufd_avx(ZEXT416(x0),0);
    auVar51 = vpshufd_avx(ZEXT416(y0),0);
    lVar34 = 0;
    auVar89 = ZEXT1664((undefined1  [16])0x0);
    auVar83._8_4_ = 8;
    auVar83._0_8_ = 0x800000008;
    auVar83._12_4_ = 8;
    uVar38 = 0;
    while (uVar38 != uVar48) {
      auVar87 = auVar89._0_16_;
      auVar67 = vpcmpgtd_avx(auVar53,auVar87);
      auVar67 = vpackssdw_avx(auVar67,auVar67);
      auVar90 = auVar89._16_16_;
      auVar88 = vpcmpgtd_avx(auVar53,auVar90);
      auVar67 = vpunpcklwd_avx(auVar67,auVar67);
      auVar91._16_16_ = auVar88;
      auVar91._0_16_ = auVar67;
      auVar67 = vpaddd_avx(auVar87,auVar51);
      auVar88 = vpaddd_avx(auVar90,auVar51);
      auVar93._16_16_ = auVar88;
      auVar93._0_16_ = auVar67;
      auVar11 = vcvtdq2ps_avx(auVar93);
      auVar12._4_4_ = auVar11._4_4_ * (fVar77 + fVar77 * auVar85._4_4_);
      auVar12._0_4_ = auVar11._0_4_ * (fVar76 + fVar76 * auVar85._0_4_);
      auVar12._8_4_ = auVar11._8_4_ * (fVar78 + fVar78 * auVar85._8_4_);
      auVar12._12_4_ = auVar11._12_4_ * (fVar79 + fVar79 * auVar85._12_4_);
      auVar12._16_4_ = auVar11._16_4_ * (fVar80 + fVar80 * auVar85._16_4_);
      auVar12._20_4_ = auVar11._20_4_ * (fVar81 + fVar81 * auVar85._20_4_);
      auVar12._24_4_ = auVar11._24_4_ * (fVar82 + fVar82 * auVar85._24_4_);
      auVar12._28_4_ = auVar11._28_4_;
      auVar11 = vblendvps_avx(auVar58,auVar12,auVar91);
      uVar42 = 0;
      auVar94 = _DAT_01fb4ba0;
      while (uVar42 < dwidth) {
        auVar88 = auVar94._0_16_;
        auVar54 = vpcmpgtd_avx(auVar52,auVar88);
        auVar54 = vpackssdw_avx(auVar54,auVar54);
        auVar95 = auVar94._16_16_;
        auVar67 = vpcmpgtd_avx(auVar52,auVar95);
        auVar54 = vpunpcklwd_avx(auVar54,auVar54);
        auVar84._16_16_ = auVar67;
        auVar84._0_16_ = auVar54;
        auVar54 = vpaddd_avx(auVar88,auVar55);
        auVar67 = vpaddd_avx(auVar95,auVar55);
        auVar56._16_16_ = auVar67;
        auVar56._0_16_ = auVar54;
        auVar57 = vcvtdq2ps_avx(auVar56);
        auVar13._4_4_ = fVar69 * auVar57._4_4_;
        auVar13._0_4_ = fVar66 * auVar57._0_4_;
        auVar13._8_4_ = fVar70 * auVar57._8_4_;
        auVar13._12_4_ = fVar71 * auVar57._12_4_;
        auVar13._16_4_ = fVar72 * auVar57._16_4_;
        auVar13._20_4_ = fVar73 * auVar57._20_4_;
        auVar13._24_4_ = fVar74 * auVar57._24_4_;
        auVar13._28_4_ = auVar57._28_4_;
        auVar57 = vblendvps_avx(auVar58,auVar13,auVar84);
        uVar39 = (int)lVar34 + (int)uVar42;
        *(undefined1 (*) [32])(grid_u + uVar39) = auVar57;
        *(undefined1 (*) [32])(grid_v + uVar39) = auVar11;
        uVar42 = uVar42 + 8;
        auVar54 = vpaddd_avx(auVar95,auVar83);
        auVar67 = vpaddd_avx(auVar88,auVar83);
        in_ZMM8 = ZEXT1664(auVar67);
        auVar94._16_16_ = auVar54;
        auVar94._0_16_ = auVar67;
      }
      uVar38 = uVar38 + 1;
      auVar54 = vpcmpeqd_avx(auVar54,auVar54);
      auVar67 = vpsubd_avx(auVar90,auVar54);
      auVar88 = vpsubd_avx(auVar87,auVar54);
      auVar89 = ZEXT3264(CONCAT1616(auVar67,auVar88));
      lVar34 = lVar34 + (ulong)dwidth;
    }
    fVar66 = grid_u[uVar41 - 1];
    fVar69 = grid_v[uVar41 - 1];
    for (; uVar46 < (uVar33 & 0xfffffff8); uVar46 = uVar46 + 1) {
      grid_u[uVar46] = fVar66;
      grid_v[uVar46] = fVar69;
    }
    if ((patch->flags & 0x10) != 0) {
      fVar66 = patch->level[1];
      fVar69 = patch->level[2];
      iVar30 = (int)(long)patch->level[0];
      fVar70 = patch->level[3];
      iVar17 = (int)(long)fVar69;
      auVar86 = in_ZMM8._4_12_;
      if (iVar30 + 1U < swidth && y0 == 0) {
        auVar53._0_4_ = (float)((long)patch->level[0] & 0xffffffff);
        auVar53._4_12_ = auVar86;
        auVar52 = vrcpss_avx(auVar53,auVar53);
        iVar31 = (x0 * 2 + 1) * iVar30;
        pfVar36 = grid_u;
        for (uVar48 = x0; uVar48 <= x1; uVar48 = uVar48 + 1) {
          *pfVar36 = auVar52._0_4_ * (2.0 - auVar52._0_4_ * auVar53._0_4_) *
                     (float)(iVar31 / (int)(swidth * 2 + -2));
          iVar31 = iVar31 + iVar30 * 2;
          pfVar36 = pfVar36 + 1;
        }
        if (swidth - 1 == x1) {
          grid_u[uVar25] = 1.0;
        }
      }
      iVar30 = (int)(long)fVar66;
      if (iVar17 + 1U < swidth && y1 + 1 == sheight) {
        auVar54._0_4_ = (float)((long)fVar69 & 0xffffffff);
        auVar54._4_12_ = auVar86;
        auVar52 = vrcpss_avx(auVar54,auVar54);
        iVar31 = (x0 * 2 + 1) * iVar17;
        pfVar36 = grid_u + iVar45 * dwidth;
        for (uVar48 = x0; uVar48 <= x1; uVar48 = uVar48 + 1) {
          *pfVar36 = auVar52._0_4_ * (2.0 - auVar52._0_4_ * auVar54._0_4_) *
                     (float)(iVar31 / (int)(swidth * 2 + -2));
          iVar31 = iVar31 + iVar17 * 2;
          pfVar36 = pfVar36 + 1;
        }
        if (swidth - 1 == x1) {
          (grid_u + iVar45 * dwidth)[uVar25] = 1.0;
        }
      }
      iVar17 = (int)(long)fVar70;
      if (iVar30 + 1U < sheight && x0 == 0) {
        auVar55._0_4_ = (float)((long)fVar66 & 0xffffffff);
        auVar55._4_12_ = auVar86;
        auVar52 = vrcpss_avx(auVar55,auVar55);
        iVar31 = (y0 * 2 + 1) * iVar30;
        uVar41 = 0;
        for (uVar48 = y0; uVar48 <= y1; uVar48 = uVar48 + 1) {
          grid_v[(ulong)uVar25 + (ulong)uVar41] =
               auVar52._0_4_ * (2.0 - auVar52._0_4_ * auVar55._0_4_) *
               (float)(iVar31 / (int)(sheight * 2 + -2));
          iVar31 = iVar31 + iVar30 * 2;
          uVar41 = uVar41 + dwidth;
        }
        if (sheight - 1 == y1) {
          grid_v[(ulong)uVar25 + (ulong)(iVar45 * dwidth)] = 1.0;
        }
      }
      if (iVar17 + 1U < sheight && x1 + 1 == swidth) {
        auVar51._0_4_ = (float)((long)fVar70 & 0xffffffff);
        auVar51._4_12_ = auVar86;
        auVar52 = vrcpss_avx(auVar51,auVar51);
        iVar30 = (y0 * 2 + 1) * iVar17;
        uVar46 = 0;
        for (; y0 <= y1; y0 = y0 + 1) {
          grid_v[uVar46] =
               auVar52._0_4_ * (2.0 - auVar52._0_4_ * auVar51._0_4_) *
               (float)(iVar30 / (int)(sheight * 2 + -2));
          iVar30 = iVar30 + iVar17 * 2;
          uVar46 = (ulong)((int)uVar46 + dwidth);
        }
        if (sheight - 1 == y1) {
          grid_v[iVar45 * dwidth] = 1.0;
        }
      }
    }
    for (lVar34 = 0; (ulong)(uVar33 >> 3) << 5 != lVar34; lVar34 = lVar34 + 0x20) {
      puVar2 = (undefined8 *)((long)grid_u + lVar34);
      local_10c0[0]._0_8_ = *puVar2;
      local_10c0[0]._8_8_ = puVar2[1];
      local_10c0[0]._16_8_ = puVar2[2];
      local_10c0[0]._24_8_ = puVar2[3];
      puVar2 = (undefined8 *)((long)grid_v + lVar34);
      local_4de0._0_8_ = *puVar2;
      local_4de0._8_8_ = puVar2[1];
      local_4de0._16_8_ = puVar2[2];
      local_4de0._24_8_ = puVar2[3];
      auVar60 = ZEXT1664(auVar60._0_16_);
      auVar68 = ZEXT1664(auVar68._0_16_);
      patchEval<embree::vfloat_impl<8>>
                (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
      fVar69 = auVar68._28_4_;
      fVar66 = auVar60._28_4_;
      if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
        patchNormal<embree::vfloat_impl<8>>
                  (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
        auVar21._8_8_ = local_4dc0._8_8_;
        auVar21._0_8_ = local_4dc0._0_8_;
        auVar21._16_4_ = local_4dc0.i[4];
        auVar21._20_4_ = local_4dc0.i[5];
        auVar21._24_8_ = local_4dc0._24_8_;
        auVar22._8_8_ = paStack_4d98;
        auVar22._0_8_ = local_4da0;
        auVar22._16_8_ = puStack_4d90;
        auVar22._24_8_ = pauStack_4d88;
        auVar23._8_8_ = ppfStack_4d78;
        auVar23._0_8_ = local_4d80;
        auVar23._16_8_ = paStack_4d70;
        auVar23._24_4_ = fStack_4d68;
        auVar23._28_4_ = uStack_4d64;
        fVar70 = SUB84(local_4d80,0);
        fVar73 = (float)((ulong)local_4d80 >> 0x20);
        fVar77 = SUB84(ppfStack_4d78,0);
        fVar80 = (float)((ulong)ppfStack_4d78 >> 0x20);
        fVar92 = SUB84(paStack_4d70,0);
        fVar97 = (float)((ulong)paStack_4d70 >> 0x20);
        fVar71 = SUB84(local_4da0,0);
        fVar74 = (float)((ulong)local_4da0 >> 0x20);
        fVar78 = SUB84(paStack_4d98,0);
        fVar81 = (float)((ulong)paStack_4d98 >> 0x20);
        fVar96 = SUB84(puStack_4d90,0);
        fVar98 = (float)((ulong)puStack_4d90 >> 0x20);
        fVar99 = SUB84(pauStack_4d88,0);
        fVar72 = (float)local_4dc0._0_8_;
        fVar76 = (float)((ulong)local_4dc0._0_8_ >> 0x20);
        fVar79 = (float)local_4dc0._8_8_;
        fVar82 = (float)((ulong)local_4dc0._8_8_ >> 0x20);
        fVar100 = (float)local_4dc0._24_8_;
        auVar59._0_4_ = fVar72 * fVar72 + fVar70 * fVar70 + fVar71 * fVar71;
        auVar59._4_4_ = fVar76 * fVar76 + fVar73 * fVar73 + fVar74 * fVar74;
        auVar59._8_4_ = fVar79 * fVar79 + fVar77 * fVar77 + fVar78 * fVar78;
        auVar59._12_4_ = fVar82 * fVar82 + fVar80 * fVar80 + fVar81 * fVar81;
        auVar59._16_4_ = local_4dc0.v[4] * local_4dc0.v[4] + fVar92 * fVar92 + fVar96 * fVar96;
        auVar59._20_4_ = local_4dc0.v[5] * local_4dc0.v[5] + fVar97 * fVar97 + fVar98 * fVar98;
        auVar59._24_4_ = fVar100 * fVar100 + fStack_4d68 * fStack_4d68 + fVar99 * fVar99;
        auVar59._28_4_ = fVar69 + fVar66 + fVar69;
        auVar11 = vrsqrtps_avx(auVar59);
        auVar85 = vcmpps_avx(auVar59,_DAT_01f7b000,0);
        fVar66 = auVar11._0_4_;
        fVar69 = auVar11._4_4_;
        fVar61 = auVar11._8_4_;
        fVar62 = auVar11._12_4_;
        fVar63 = auVar11._16_4_;
        fVar64 = auVar11._20_4_;
        fVar65 = auVar11._24_4_;
        fVar66 = fVar66 * 1.5 + fVar66 * fVar66 * fVar66 * auVar59._0_4_ * -0.5;
        fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar59._4_4_ * -0.5;
        fVar61 = fVar61 * 1.5 + fVar61 * fVar61 * fVar61 * auVar59._8_4_ * -0.5;
        fVar62 = fVar62 * 1.5 + fVar62 * fVar62 * fVar62 * auVar59._12_4_ * -0.5;
        fVar63 = fVar63 * 1.5 + fVar63 * fVar63 * fVar63 * auVar59._16_4_ * -0.5;
        fVar64 = fVar64 * 1.5 + fVar64 * fVar64 * fVar64 * auVar59._20_4_ * -0.5;
        fVar65 = fVar65 * 1.5 + fVar65 * fVar65 * fVar65 * auVar59._24_4_ * -0.5;
        auVar67._0_4_ = fVar72 * fVar66;
        auVar67._4_4_ = fVar76 * fVar69;
        auVar67._8_4_ = fVar79 * fVar61;
        auVar67._12_4_ = fVar82 * fVar62;
        auVar14._16_4_ = local_4dc0.v[4] * fVar63;
        auVar14._0_16_ = auVar67;
        auVar14._20_4_ = local_4dc0.v[5] * fVar64;
        auVar14._24_4_ = fVar100 * fVar65;
        auVar14._28_4_ = auVar11._28_4_;
        auVar15._4_4_ = fVar74 * fVar69;
        auVar15._0_4_ = fVar71 * fVar66;
        auVar15._8_4_ = fVar78 * fVar61;
        auVar15._12_4_ = fVar81 * fVar62;
        auVar15._16_4_ = fVar96 * fVar63;
        auVar15._20_4_ = fVar98 * fVar64;
        auVar15._24_4_ = fVar99 * fVar65;
        auVar15._28_4_ = 0x3fc00000;
        auVar52._0_4_ = fVar70 * fVar66;
        auVar52._4_4_ = fVar73 * fVar69;
        auVar52._8_4_ = fVar77 * fVar61;
        auVar52._12_4_ = fVar80 * fVar62;
        auVar16._16_4_ = fVar92 * fVar63;
        auVar16._0_16_ = auVar52;
        auVar16._20_4_ = fVar97 * fVar64;
        auVar16._24_4_ = fStack_4d68 * fVar65;
        auVar16._28_4_ = auVar59._28_4_ + 1.5;
        local_3d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                     vblendvps_avx(auVar14,auVar21,auVar85);
        local_3d60 = vblendvps_avx(auVar15,auVar22,auVar85);
        local_3d40[0] = vblendvps_avx(auVar16,auVar23,auVar85);
        local_4dc0._0_8_ = (geom->super_Geometry).userPtr;
        local_4dc0._8_8_ = geom;
        local_4dc0.v[4] = (float)patch->prim;
        local_4dc0.v[5] = (float)patch->time_;
        local_4dc0._24_8_ = local_10c0;
        paStack_4d98 = &local_3d80;
        puStack_4d90 = local_3d60;
        pauStack_4d88 = local_3d40;
        local_4d80 = &local_2d40;
        ppfStack_4d78 = &local_2d20;
        paStack_4d70 = &local_2d00;
        fStack_4d68 = 1.12104e-44;
        auVar60 = ZEXT1664(auVar52);
        auVar68 = ZEXT1664(auVar67);
        local_4da0 = &local_4de0;
        (**(code **)&(geom->super_Geometry).field_0x58)(&local_4dc0);
      }
      puVar2 = (undefined8 *)((long)grid_x + lVar34);
      *puVar2 = local_2d40._0_8_;
      puVar2[1] = local_2d40._8_8_;
      puVar2[2] = CONCAT44(uStack_2d2c,uStack_2d30);
      puVar2[3] = pfStack_2d28;
      puVar2 = (undefined8 *)((long)grid_y + lVar34);
      *puVar2 = local_2d20;
      puVar2[1] = paStack_2d18;
      puVar2[2] = paStack_2d10;
      puVar2[3] = paStack_2d08;
      puVar2 = (undefined8 *)((long)grid_z + lVar34);
      *puVar2 = local_2d00._0_8_;
      puVar2[1] = local_2d00._8_8_;
      puVar2[2] = pfStack_2cf0;
      puVar2[3] = CONCAT44(uStack_2ce4,uStack_2ce8);
    }
  }
  return;
}

Assistant:

void evalGrid(const SubdivPatch1Base& patch,
                  const unsigned x0, const unsigned x1,
                  const unsigned y0, const unsigned y1,
                  const unsigned swidth, const unsigned sheight,
                  float *__restrict__ const grid_x,
                  float *__restrict__ const grid_y,
                  float *__restrict__ const grid_z,
                  float *__restrict__ const grid_u,
                  float *__restrict__ const grid_v,
                  const SubdivMesh* const geom)
    {
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        const unsigned N = displ ? M : 0;
        dynamic_large_stack_array(float,grid_Ng_x,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,N,32*32*sizeof(float));
        
        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        }
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid<FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa> 
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* convert sub-patch UVs to patch UVs*/
        const Vec2f uv0 = patch.getUV(0);
        const Vec2f uv1 = patch.getUV(1);
        const Vec2f uv2 = patch.getUV(2);
        const Vec2f uv3 = patch.getUV(3);
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          const vfloatx patch_u = lerp2(uv0.x,uv1.x,uv3.x,uv2.x,u,v);
          const vfloatx patch_v = lerp2(uv0.y,uv1.y,uv3.y,uv2.y,u,v);
          vfloatx::store(&grid_u[i*VSIZEX],patch_u);
          vfloatx::store(&grid_v[i*VSIZEX],patch_v);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc)) {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch, u, v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          vfloatx::store(&grid_x[i*VSIZEX],vtx.x);
          vfloatx::store(&grid_y[i*VSIZEX],vtx.y);
          vfloatx::store(&grid_z[i*VSIZEX],vtx.z);
        }
      }
    }